

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O2

int normal_isPublicId(ENCODING *enc,char *ptr,char *end,char **badPtr)

{
  byte bVar1;
  char *pcVar2;
  byte *pbVar3;
  ulong uVar4;
  
  pbVar3 = (byte *)(ptr + 1);
  pcVar2 = end + (-2 - (long)ptr);
  do {
    if ((long)pcVar2 < 1) {
      return 1;
    }
    bVar1 = *pbVar3;
    uVar4 = (ulong)*(byte *)((long)enc[1].scanners + (ulong)bVar1);
    if (0x23 < uVar4) goto LAB_005a81d4;
    if ((0xfcb0fe600U >> (uVar4 & 0x3f) & 1) == 0) {
      if ((0x4400000UL >> (uVar4 & 0x3f) & 1) == 0) {
        if (uVar4 != 0x15) goto LAB_005a81d4;
        if (bVar1 == 9) goto LAB_005a81e0;
      }
      else if ((char)bVar1 < '\0') {
LAB_005a81d4:
        if ((bVar1 != 0x24) && (bVar1 != 0x40)) {
LAB_005a81e0:
          *badPtr = (char *)pbVar3;
          return 0;
        }
      }
    }
    pbVar3 = pbVar3 + 1;
    pcVar2 = pcVar2 + -1;
  } while( true );
}

Assistant:

static int PTRCALL
PREFIX(isPublicId)(const ENCODING *enc, const char *ptr, const char *end,
                   const char **badPtr) {
  ptr += MINBPC(enc);
  end -= MINBPC(enc);
  for (; HAS_CHAR(enc, ptr, end); ptr += MINBPC(enc)) {
    switch (BYTE_TYPE(enc, ptr)) {
    case BT_DIGIT:
    case BT_HEX:
    case BT_MINUS:
    case BT_APOS:
    case BT_LPAR:
    case BT_RPAR:
    case BT_PLUS:
    case BT_COMMA:
    case BT_SOL:
    case BT_EQUALS:
    case BT_QUEST:
    case BT_CR:
    case BT_LF:
    case BT_SEMI:
    case BT_EXCL:
    case BT_AST:
    case BT_PERCNT:
    case BT_NUM:
#  ifdef XML_NS
    case BT_COLON:
#  endif
      break;
    case BT_S:
      if (CHAR_MATCHES(enc, ptr, ASCII_TAB)) {
        *badPtr = ptr;
        return 0;
      }
      break;
    case BT_NAME:
    case BT_NMSTRT:
      if (! (BYTE_TO_ASCII(enc, ptr) & ~0x7f))
        break;
      /* fall through */
    default:
      switch (BYTE_TO_ASCII(enc, ptr)) {
      case 0x24: /* $ */
      case 0x40: /* @ */
        break;
      default:
        *badPtr = ptr;
        return 0;
      }
      break;
    }
  }
  return 1;
}